

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader-test.cc
# Opt level: O3

void __thiscall BinaryReaderTest_ReadInt_Test::TestBody(BinaryReaderTest_ReadInt_Test *this)

{
  BinaryReader<mp::internal::IdentityConverter> *this_00;
  char cVar1;
  bool bVar2;
  char *pcVar3;
  long lVar4;
  AssertionResult gtest_ar_2;
  int data [3];
  AssertionResult gtest_ar;
  size_t size;
  NLStringRef str;
  TestBinaryReader<mp::internal::IdentityConverter> reader;
  AssertHelper local_160;
  AssertionResult local_158;
  char local_148 [16];
  undefined1 local_138 [32];
  _Alloc_hider local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  BinaryReader<mp::internal::EndiannessConverter> local_f8;
  unsigned_long local_b8;
  int local_ac;
  NLStringRef local_a8;
  TestBinaryReader<mp::internal::IdentityConverter> local_98;
  
  local_148[0] = '\v';
  local_148[1] = '\0';
  local_148[2] = '\0';
  local_148[3] = '\0';
  local_148[4] = -0x16;
  local_148[5] = -1;
  local_148[6] = -1;
  local_148[7] = -1;
  local_148[8] = '\0';
  local_148[9] = '\0';
  local_148[10] = '\0';
  local_148[0xb] = '\0';
  local_b8 = 8;
  mp::NLStringRef::NLStringRef(&local_a8,local_148,8);
  TestBinaryReader<mp::internal::IdentityConverter>::TestBinaryReader
            (&local_98,local_a8,(CStringRef)0x27a539);
  local_158.success_ = true;
  local_158._1_3_ = 0;
  this_00 = &local_98.super_BinaryReader<mp::internal::IdentityConverter>;
  local_98.super_BinaryReader<mp::internal::IdentityConverter>.super_BinaryReaderBase.
  super_ReaderBase.token_ =
       local_98.super_BinaryReader<mp::internal::IdentityConverter>.super_BinaryReaderBase.
       super_ReaderBase.ptr_;
  pcVar3 = mp::internal::BinaryReaderBase::Read(&this_00->super_BinaryReaderBase,4);
  local_160.data_._0_4_ = *(undefined4 *)pcVar3;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_138,"11","reader.ReadInt<int>()",(int *)&local_158,(int *)&local_160)
  ;
  if (local_138[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_158);
    if ((char *)local_138._8_8_ == (char *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_138._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
               0x16e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_160,(Message *)&local_158);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    if (((CONCAT44(local_158._4_4_,local_158._0_4_) != 0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       ((long *)CONCAT44(local_158._4_4_,local_158._0_4_) != (long *)0x0)) {
      (**(code **)(*(long *)CONCAT44(local_158._4_4_,local_158._0_4_) + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_138 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_158.success_ = true;
  local_158._1_3_ = 0xffffff;
  local_98.super_BinaryReader<mp::internal::IdentityConverter>.super_BinaryReaderBase.
  super_ReaderBase.token_ =
       local_98.super_BinaryReader<mp::internal::IdentityConverter>.super_BinaryReaderBase.
       super_ReaderBase.ptr_;
  pcVar3 = mp::internal::BinaryReaderBase::Read(&this_00->super_BinaryReaderBase,4);
  local_160.data_._0_4_ = *(undefined4 *)pcVar3;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_138,"-22","reader.ReadInt<int>()",(int *)&local_158,(int *)&local_160
            );
  if (local_138[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_158);
    if ((char *)local_138._8_8_ == (char *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_138._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
               0x16f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_160,(Message *)&local_158);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    if (((CONCAT44(local_158._4_4_,local_158._0_4_) != 0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       ((long *)CONCAT44(local_158._4_4_,local_158._0_4_) != (long *)0x0)) {
      (**(code **)(*(long *)CONCAT44(local_158._4_4_,local_158._0_4_) + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_138 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  testing::AssertionSuccess();
  if (local_158.success_ == true) {
    fmt::format<unsigned_long>((string *)local_138,(CStringRef)0x25e3c2,&local_b8);
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_98.super_BinaryReader<mp::internal::IdentityConverter>.super_BinaryReaderBase.
      super_ReaderBase.token_ =
           local_98.super_BinaryReader<mp::internal::IdentityConverter>.super_BinaryReaderBase.
           super_ReaderBase.ptr_;
      mp::internal::BinaryReaderBase::Read(&this_00->super_BinaryReaderBase,4);
    }
    testing::AssertionResult::operator<<
              (&local_158,
               (char (*) [110])
               "Expected: reader.ReadInt<int>() throws an exception of type mp::BinaryReadError.\n  Actual: it throws nothing."
              );
    if ((undefined1 *)CONCAT71(local_138._1_7_,local_138[0]) != local_138 + 0x10) {
      operator_delete((undefined1 *)CONCAT71(local_138._1_7_,local_138[0]),local_138._16_8_ + 1);
    }
  }
  testing::Message::Message((Message *)local_138);
  if (local_158.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar3 = "";
  }
  else {
    pcVar3 = ((local_158.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_160,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x171,pcVar3);
  testing::internal::AssertHelper::operator=(&local_160,(Message *)local_138);
  testing::internal::AssertHelper::~AssertHelper(&local_160);
  if (((CONCAT71(local_138._1_7_,local_138[0]) != 0) &&
      (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     ((long *)CONCAT71(local_138._1_7_,local_138[0]) != (long *)0x0)) {
    (**(code **)(*(long *)CONCAT71(local_138._1_7_,local_138[0]) + 8))();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_158.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  pcVar3 = local_148 + 3;
  lVar4 = 0;
  do {
    cVar1 = local_148[lVar4];
    local_148[lVar4] = *pcVar3;
    *pcVar3 = cVar1;
    lVar4 = lVar4 + 1;
    pcVar3 = pcVar3 + -1;
  } while (lVar4 != 2);
  local_160.data_._0_4_ = 0xb;
  TestBinaryReader<mp::internal::EndiannessConverter>::TestBinaryReader
            ((TestBinaryReader<mp::internal::EndiannessConverter> *)local_138,local_a8,
             (CStringRef)0x27a539);
  local_ac = mp::internal::BinaryReader<mp::internal::EndiannessConverter>::ReadInt<int>(&local_f8);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_158,"11","TestBinaryReader<EndiannessConverter>(str).ReadInt<int>()"
             ,(int *)&local_160,&local_ac);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.super_BinaryReaderBase.super_ReaderBase.name_._M_dataplus._M_p !=
      &local_f8.super_BinaryReaderBase.super_ReaderBase.name_.field_2) {
    operator_delete(local_f8.super_BinaryReaderBase.super_ReaderBase.name_._M_dataplus._M_p,
                    local_f8.super_BinaryReaderBase.super_ReaderBase.name_.field_2.
                    _M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_p != &local_108) {
    operator_delete(local_118._M_p,local_108._M_allocated_capacity + 1);
  }
  if (local_158.success_ == false) {
    testing::Message::Message((Message *)local_138);
    if (local_158.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_158.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
               0x173,pcVar3);
    testing::internal::AssertHelper::operator=(&local_160,(Message *)local_138);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    if (((CONCAT71(local_138._1_7_,local_138[0]) != 0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       ((long *)CONCAT71(local_138._1_7_,local_138[0]) != (long *)0x0)) {
      (**(code **)(*(long *)CONCAT71(local_138._1_7_,local_138[0]) + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_158.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.super_BinaryReader<mp::internal::IdentityConverter>.super_BinaryReaderBase.
         super_ReaderBase.name_._M_dataplus._M_p !=
      &local_98.super_BinaryReader<mp::internal::IdentityConverter>.super_BinaryReaderBase.
       super_ReaderBase.name_.field_2) {
    operator_delete(local_98.super_BinaryReader<mp::internal::IdentityConverter>.
                    super_BinaryReaderBase.super_ReaderBase.name_._M_dataplus._M_p,
                    local_98.super_BinaryReader<mp::internal::IdentityConverter>.
                    super_BinaryReaderBase.super_ReaderBase.name_.field_2._M_allocated_capacity + 1)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.super_TestReaderBase.super_ReaderBase.name_._M_dataplus._M_p !=
      &local_98.super_TestReaderBase.super_ReaderBase.name_.field_2) {
    operator_delete(local_98.super_TestReaderBase.super_ReaderBase.name_._M_dataplus._M_p,
                    local_98.super_TestReaderBase.super_ReaderBase.name_.field_2.
                    _M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TEST(BinaryReaderTest, ReadInt) {
  int data[] = {11, -22, 0};
  std::size_t size = sizeof(data) - sizeof(int);
  mp::NLStringRef str(reinterpret_cast<char*>(data), size);
  TestBinaryReader<> reader(str);
  EXPECT_EQ(11, reader.ReadInt<int>());
  EXPECT_EQ(-22, reader.ReadInt<int>());
  EXPECT_THROW_MSG(reader.ReadInt<int>(), mp::BinaryReadError,
                   fmt::format("test:offset {}: unexpected end of file", size));
  ChangeEndianness(data[0]);
  EXPECT_EQ(11, TestBinaryReader<EndiannessConverter>(str).ReadInt<int>());
}